

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parse_internal(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *this,bool keep,
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *result)

{
  number_float_t nVar1;
  parse_event_t __args_1;
  bool bVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  json_value jVar5;
  object_t *poVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  *pmVar7;
  out_of_range *__return_storage_ptr__;
  token_type t;
  int iVar8;
  char cVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  uint local_84;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  *local_80;
  json_value *local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value_1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  k;
  
  if (this->errored == true) {
    __assert_fail("not errored",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                  ,0xcb3,
                  "void nlohmann::detail::parser<nlohmann::basic_json<>>::parse_internal(bool, BasicJsonType &) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  if (result->m_type != discarded) {
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&(result->m_value).boolean,result->m_type);
    result->m_type = discarded;
  }
  switch(this->last_token) {
  case literal_true:
    result->m_type = boolean;
    (result->m_value).number_integer = 1;
    break;
  case literal_false:
    result->m_type = boolean;
    (result->m_value).object = (object_t *)0x0;
    break;
  case literal_null:
    result->m_type = null;
    break;
  case value_string:
    result->m_type = string;
    std::__cxx11::string::string((string *)&value,(string *)&(this->m_lexer).token_buffer);
    pbVar4 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::create<std::__cxx11::string,std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value)
    ;
    (result->m_value).object = (object_t *)pbVar4;
    std::__cxx11::string::~string((string *)&value);
    break;
  case value_unsigned:
    result->m_type = number_unsigned;
    jVar5 = (json_value)(this->m_lexer).value_unsigned;
    goto LAB_0014ea92;
  case value_integer:
    result->m_type = number_integer;
    jVar5 = (json_value)(this->m_lexer).value_integer;
LAB_0014ea92:
    result->m_value = jVar5;
    break;
  case value_float:
    result->m_type = number_float;
    nVar1 = (this->m_lexer).value_float;
    (result->m_value).number_unsigned = (number_unsigned_t)nVar1;
    if (0x7fefffffffffffff < (ulong)ABS(nVar1)) {
      if (this->allow_exceptions == true) {
        __return_storage_ptr__ = (out_of_range *)__cxa_allocate_exception(0x20);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)&value_1,&this->m_lexer);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&k,
                       "number overflow parsing \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&k,"\'")
        ;
        out_of_range::create(__return_storage_ptr__,0x196,(string *)&value);
        __cxa_throw(__return_storage_ptr__,&out_of_range::typeinfo,exception::~exception);
      }
      expect(this,uninitialized);
    }
    break;
  case begin_array:
    if (keep) {
      if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
        keep = true;
      }
      else {
        iVar8 = this->depth;
        this->depth = iVar8 + 1;
        keep = std::
               function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               ::operator()(&this->callback,iVar8,array_start,result);
        if ((!keep) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0))
        goto LAB_0014eb0c;
      }
      result->m_type = array;
      poVar6 = (object_t *)
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::
               create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                         ();
      (result->m_value).object = poVar6;
    }
    else {
      keep = false;
    }
LAB_0014eb0c:
    get_token(this);
    if (this->last_token != end_array) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&value,(nullptr_t)0x0);
      while( true ) {
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&value.m_value.boolean,value.m_type);
        value.m_type = discarded;
        parse_internal(this,keep,&value);
        if (this->errored != false) break;
        if ((keep != false) && (value.m_type != discarded)) {
          std::
          vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
          ::
          emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                      *)(result->m_value).object,&value);
        }
        get_token(this);
        if (this->last_token != value_separator) {
          bVar2 = expect(this,end_array);
          if ((bVar2 & keep) == 1) {
            cVar9 = '\x02';
            if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
              iVar8 = this->depth + -1;
              this->depth = iVar8;
              bVar2 = std::
                      function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                      ::operator()(&this->callback,iVar8,array_end,result);
              if (!bVar2) {
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::json_value::destroy((json_value *)&(result->m_value).boolean,result->m_type);
                result->m_type = discarded;
              }
            }
          }
          else {
            cVar9 = bVar2 + '\x01';
          }
          goto LAB_0014ec0c;
        }
        get_token(this);
      }
      cVar9 = '\x01';
LAB_0014ec0c:
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&value);
joined_r0x0014ee5a:
      if (cVar9 == '\x01') {
        return;
      }
      break;
    }
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) break;
    iVar8 = this->depth + -1;
    this->depth = iVar8;
    __args_1 = array_end;
    goto LAB_0014ec63;
  case begin_object:
    if (keep) {
      if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
        keep = true;
      }
      else {
        iVar8 = this->depth;
        this->depth = iVar8 + 1;
        keep = std::
               function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               ::operator()(&this->callback,iVar8,object_start,result);
        if ((!keep) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0))
        goto LAB_0014ec35;
      }
      result->m_type = object;
      pmVar7 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::
               create<std::map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>>
                         ();
      (result->m_value).object = pmVar7;
    }
    else {
      keep = false;
    }
LAB_0014ec35:
    get_token(this);
    if (this->last_token != end_object) {
      cVar9 = '\x01';
      value._0_8_ = &local_98;
      value.m_value.object = (object_t *)0x0;
      local_98._M_local_buf[0] = '\0';
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&value_1,(nullptr_t)0x0);
      local_80 = &this->callback;
      local_78 = (json_value *)&result->m_value;
      local_84 = (uint)keep;
      while (bVar2 = expect(this,value_string), bVar2) {
        std::__cxx11::string::string((string *)&k,(string *)&(this->m_lexer).token_buffer);
        std::__cxx11::string::operator=((string *)&value,(string *)&k);
        std::__cxx11::string::~string((string *)&k);
        bVar2 = true;
        if (keep != false) {
          if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
            bVar2 = false;
          }
          else {
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &value);
            bVar2 = std::
                    function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                    ::operator()(local_80,this->depth,key,&k);
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&k);
            bVar2 = !bVar2;
          }
        }
        get_token(this);
        bVar3 = expect(this,name_separator);
        if (!bVar3) break;
        get_token(this);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&value_1.m_value.boolean,value_1.m_type);
        value_1.m_type = discarded;
        parse_internal(this,SUB41(local_84,0),&value_1);
        if (this->errored != false) break;
        if ((!bVar2 && keep == true) && (value_1.m_type != discarded)) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
          ::
          _M_emplace_unique<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                       **)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                     &value_1);
        }
        get_token(this);
        if (this->last_token != value_separator) {
          bVar2 = expect(this,end_object);
          if ((bVar2 & keep) == 1) {
            cVar9 = '\x02';
            if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
              iVar8 = this->depth + -1;
              this->depth = iVar8;
              bVar2 = std::
                      function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                      ::operator()(local_80,iVar8,object_end,result);
              if (!bVar2) {
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::json_value::destroy(local_78,result->m_type);
                result->m_type = discarded;
                cVar9 = '\x02';
              }
            }
          }
          else {
            cVar9 = bVar2 + '\x01';
          }
          break;
        }
        get_token(this);
      }
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&value_1);
      std::__cxx11::string::~string((string *)&value);
      goto joined_r0x0014ee5a;
    }
    if ((keep == false) || ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0))
    break;
    iVar8 = this->depth + -1;
    this->depth = iVar8;
    __args_1 = object_end;
LAB_0014ec63:
    bVar2 = std::
            function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
            ::operator()(&this->callback,iVar8,__args_1,result);
    if (!bVar2) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&(result->m_value).boolean,result->m_type);
      result->m_type = discarded;
    }
    break;
  default:
    t = literal_or_value;
    goto LAB_0014eaa0;
  case parse_error:
    t = uninitialized;
LAB_0014eaa0:
    bVar2 = expect(this,t);
    if (!bVar2) {
      return;
    }
  }
  if (((keep != false) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0))
     && (bVar2 = std::
                 function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                 ::operator()(&this->callback,this->depth,value,result), !bVar2)) {
    result->m_type = discarded;
  }
  return;
}

Assistant:

void parse_internal(bool keep, BasicJsonType& result)
{
// never parse after a parse error was detected
assert(not errored);

// start with a discarded value
if (not result.is_discarded())
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}

switch (last_token)
{
case token_type::begin_object:
{
if (keep)
{
if (callback)
{
keep = callback(depth++, parse_event_t::object_start, result);
}

if (not callback or keep)
{
// explicitly set result to object to cope with {}
result.m_type = value_t::object;
result.m_value = value_t::object;
}
}

// read next token
get_token();

// closing } -> we are done
if (last_token == token_type::end_object)
{
if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

// parse values
std::string key;
BasicJsonType value;
while (true)
{
// store key
if (not expect(token_type::value_string))
{
return;
}
key = m_lexer.move_string();

bool keep_tag = false;
if (keep)
{
if (callback)
{
BasicJsonType k(key);
keep_tag = callback(depth, parse_event_t::key, k);
}
else
{
keep_tag = true;
}
}

// parse separator (:)
get_token();
if (not expect(token_type::name_separator))
{
return;
}

// parse and add value
get_token();
value.m_value.destroy(value.m_type);
value.m_type = value_t::discarded;
parse_internal(keep, value);

if (JSON_UNLIKELY(errored))
{
return;
}

if (keep and keep_tag and not value.is_discarded())
{
result.m_value.object->emplace(std::move(key), std::move(value));
}

// comma -> next value
get_token();
if (last_token == token_type::value_separator)
{
get_token();
continue;
}

// closing }
if (not expect(token_type::end_object))
{
return;
}
break;
}

if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

case token_type::begin_array:
{
if (keep)
{
if (callback)
{
keep = callback(depth++, parse_event_t::array_start, result);
}

if (not callback or keep)
{
// explicitly set result to array to cope with []
result.m_type = value_t::array;
result.m_value = value_t::array;
}
}

// read next token
get_token();

// closing ] -> we are done
if (last_token == token_type::end_array)
{
if (callback and not callback(--depth, parse_event_t::array_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

// parse values
BasicJsonType value;
while (true)
{
// parse value
value.m_value.destroy(value.m_type);
value.m_type = value_t::discarded;
parse_internal(keep, value);

if (JSON_UNLIKELY(errored))
{
return;
}

if (keep and not value.is_discarded())
{
result.m_value.array->push_back(std::move(value));
}

// comma -> next value
get_token();
if (last_token == token_type::value_separator)
{
get_token();
continue;
}

// closing ]
if (not expect(token_type::end_array))
{
return;
}
break;
}

if (keep and callback and not callback(--depth, parse_event_t::array_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

case token_type::literal_null:
{
result.m_type = value_t::null;
break;
}

case token_type::value_string:
{
result.m_type = value_t::string;
result.m_value = m_lexer.move_string();
break;
}

case token_type::literal_true:
{
result.m_type = value_t::boolean;
result.m_value = true;
break;
}

case token_type::literal_false:
{
result.m_type = value_t::boolean;
result.m_value = false;
break;
}

case token_type::value_unsigned:
{
result.m_type = value_t::number_unsigned;
result.m_value = m_lexer.get_number_unsigned();
break;
}

case token_type::value_integer:
{
result.m_type = value_t::number_integer;
result.m_value = m_lexer.get_number_integer();
break;
}

case token_type::value_float:
{
result.m_type = value_t::number_float;
result.m_value = m_lexer.get_number_float();

// throw in case of infinity or NAN
if (JSON_UNLIKELY(not std::isfinite(result.m_value.number_float)))
{
if (allow_exceptions)
{
JSON_THROW(out_of_range::create(406, "number overflow parsing '" +
m_lexer.get_token_string() + "'"));
}
expect(token_type::uninitialized);
}
break;
}

case token_type::parse_error:
{
// using "uninitialized" to avoid "expected" message
if (not expect(token_type::uninitialized))
{
return;
}
break; // LCOV_EXCL_LINE
}

default:
{
// the last token was unexpected; we expected a value
if (not expect(token_type::literal_or_value))
{
return;
}
break; // LCOV_EXCL_LINE
}
}

if (keep and callback and not callback(depth, parse_event_t::value, result))
{
result.m_type = value_t::discarded;
}
}